

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O3

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  
  puVar1 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar2 == puVar1) {
      return false;
    }
    cVar3 = (**(code **)((long)((*(cmInstallGenerator **)puVar2)->super_cmScriptGenerator).
                               _vptr_cmScriptGenerator + 0x40))();
    puVar2 = (pointer)((long)puVar2 + 8);
  } while (cVar3 == '\0');
  return (bool)cVar3;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (const auto& generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}